

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestInclude::Run(ParserTestInclude *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference __rhs;
  allocator<char> local_b1;
  string local_b0;
  string local_90;
  int local_70;
  allocator<char> local_69;
  int fail_count;
  allocator<char> local_31;
  string local_30;
  ParserTestInclude *local_10;
  ParserTestInclude *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"include.ninja",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fail_count,"var = inner\n",&local_69);
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_30,(string *)&fail_count);
  std::__cxx11::string::~string((string *)&fail_count);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_70 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse(&this->super_ParserTest,"var = outer\ninclude include.ninja\n");
  iVar2 = local_70;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->super_ParserTest).fs_.files_read_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar5 == 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                       ,0x3a5,"1u == fs_.files_read_.size()");
    pTVar1 = g_current_test;
    if (bVar3) {
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&(this->super_ParserTest).fs_.files_read_,0);
      bVar3 = std::operator==("include.ninja",__rhs);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x3a6,"\"include.ninja\" == fs_.files_read_[0]");
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"var",&local_b1);
      BindingEnv::LookupVariable(&local_90,&(this->super_ParserTest).state.bindings_,&local_b0);
      bVar3 = std::operator==("inner",&local_90);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
                 ,0x3a7,"\"inner\" == state.bindings_.LookupVariable(\"var\")");
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, Include) {
  fs_.Create("include.ninja", "var = inner\n");
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"var = outer\n"
"include include.ninja\n"));

  ASSERT_EQ(1u, fs_.files_read_.size());
  EXPECT_EQ("include.ninja", fs_.files_read_[0]);
  EXPECT_EQ("inner", state.bindings_.LookupVariable("var"));
}